

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O0

void __thiscall qclab::qgates::CX<double>::CX(CX<double> *this)

{
  CX<double> *this_local;
  
  QControlledGate2<double>::QControlledGate2(&this->super_QControlledGate2<double>,0,1);
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_007598a8;
  std::make_unique<qclab::qgates::PauliX<double>,int>((int *)&this->gate_);
  return;
}

Assistant:

CX()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliX< T > >( 1 ) )
        { }